

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-netcdf.c
# Opt level: O0

int read_att_array(coda_netcdf_product *product,int64_t *offset,coda_mem_record **attributes,
                  coda_conversion *conversion)

{
  undefined4 uVar1;
  int iVar2;
  coda_mem_record *pcVar3;
  coda_netcdf_array *field_type;
  undefined1 auVar4 [16];
  long local_e8;
  long dim [8];
  coda_netcdf_array *array;
  anon_union_8_10_151d62c6 value_2;
  double value_1;
  char *pcStack_80;
  float value;
  char *name;
  long value_length;
  int64_t nelems;
  ulong uStack_60;
  int32_t nc_type;
  int64_t string_length;
  coda_netcdf_basic_type *basic_type;
  long i;
  int64_t num_att;
  coda_type_record *pcStack_38;
  int32_t tag;
  coda_type_record *attributes_definition;
  coda_conversion *conversion_local;
  coda_mem_record **attributes_local;
  int64_t *offset_local;
  coda_netcdf_product *product_local;
  
  attributes_definition = (coda_type_record *)conversion;
  conversion_local = (coda_conversion *)attributes;
  attributes_local = (coda_mem_record **)offset;
  offset_local = (int64_t *)product;
  iVar2 = read_bytes(product->raw_product,*offset,4,(void *)((long)&num_att + 4));
  if (iVar2 < 0) {
    product_local._4_4_ = -1;
  }
  else {
    swap4((void *)((long)&num_att + 4));
    *attributes_local = (coda_mem_record *)&(*attributes_local)->field_0x4;
    iVar2 = read_length_value((coda_netcdf_product *)offset_local,(int64_t *)attributes_local,&i);
    if (iVar2 == 0) {
      if (num_att._4_4_ == 0) {
        conversion_local->numerator = 0.0;
        if (i == 0) {
          product_local._4_4_ = 0;
        }
        else {
          coda_set_error(-300,"invalid netCDF file (invalid value for nelems for empty att_array)");
          product_local._4_4_ = -1;
        }
      }
      else if (num_att._4_4_ == 0xc) {
        pcStack_38 = coda_type_record_new(coda_format_netcdf);
        if (pcStack_38 == (coda_type_record *)0x0) {
          product_local._4_4_ = -1;
        }
        else {
          pcVar3 = coda_mem_record_new(pcStack_38,(coda_dynamic_type *)0x0);
          conversion_local->numerator = (double)pcVar3;
          coda_type_release((coda_type *)pcStack_38);
          if (conversion_local->numerator == 0.0) {
            product_local._4_4_ = -1;
          }
          else {
            for (basic_type = (coda_netcdf_basic_type *)0x0; (long)basic_type < i;
                basic_type = (coda_netcdf_basic_type *)((long)&basic_type->backend + 1)) {
              iVar2 = read_length_value((coda_netcdf_product *)offset_local,
                                        (int64_t *)attributes_local,
                                        (int64_t *)&stack0xffffffffffffffa0);
              if (iVar2 != 0) {
                coda_dynamic_type_delete((coda_dynamic_type *)conversion_local->numerator);
                return -1;
              }
              pcStack_80 = (char *)malloc(uStack_60 + 1);
              if (pcStack_80 == (char *)0x0) {
                coda_set_error(-1,"out of memory (could not allocate %lu bytes) (%s:%u)",
                               uStack_60 + 1,
                               "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-netcdf.c"
                               ,0xf1);
                coda_dynamic_type_delete((coda_dynamic_type *)conversion_local->numerator);
                return -1;
              }
              pcStack_80[uStack_60] = '\0';
              iVar2 = read_bytes((coda_product *)offset_local[9],(int64_t)*attributes_local,
                                 uStack_60,pcStack_80);
              if (iVar2 < 0) {
                free(pcStack_80);
                coda_dynamic_type_delete((coda_dynamic_type *)conversion_local->numerator);
                return -1;
              }
              *attributes_local =
                   (coda_mem_record *)((long)&(*attributes_local)->backend + uStack_60);
              if ((uStack_60 & 3) != 0) {
                *attributes_local =
                     (coda_mem_record *)((4 - (uStack_60 & 3)) + (long)*attributes_local);
              }
              iVar2 = read_bytes((coda_product *)offset_local[9],(int64_t)*attributes_local,4,
                                 (void *)((long)&nelems + 4));
              if (iVar2 < 0) {
                free(pcStack_80);
                coda_dynamic_type_delete((coda_dynamic_type *)conversion_local->numerator);
                return -1;
              }
              swap4((void *)((long)&nelems + 4));
              *attributes_local = (coda_mem_record *)&(*attributes_local)->field_0x4;
              iVar2 = read_length_value((coda_netcdf_product *)offset_local,
                                        (int64_t *)attributes_local,&value_length);
              if (iVar2 != 0) {
                free(pcStack_80);
                coda_dynamic_type_delete((coda_dynamic_type *)conversion_local->numerator);
                return -1;
              }
              name = (char *)value_length;
              switch(nelems._4_4_) {
              case 1:
              case 2:
                break;
              case 3:
                name = (char *)(value_length << 1);
                break;
              case 4:
              case 5:
                name = (char *)(value_length << 2);
                break;
              case 6:
                name = (char *)(value_length << 3);
                break;
              default:
                coda_set_error(-300,"invalid netCDF file (invalid netcdf type (%d))",
                               (ulong)nelems._4_4_);
                free(pcStack_80);
                coda_dynamic_type_delete((coda_dynamic_type *)conversion_local->numerator);
                return -1;
              }
              if (attributes_definition != (coda_type_record *)0x0) {
                if ((value_length == 1) &&
                   ((iVar2 = strcmp(pcStack_80,"scale_factor"), iVar2 == 0 ||
                    (iVar2 = strcmp(pcStack_80,"add_offset"), iVar2 == 0)))) {
                  if (nelems._4_4_ == 5) {
                    iVar2 = read_bytes((coda_product *)offset_local[9],(int64_t)*attributes_local,4,
                                       (void *)((long)&value_1 + 4));
                    if (iVar2 < 0) {
                      free(pcStack_80);
                      coda_dynamic_type_delete((coda_dynamic_type *)conversion_local->numerator);
                      return -1;
                    }
                    swap4((void *)((long)&value_1 + 4));
                    if (*pcStack_80 == 's') {
                      *(double *)attributes_definition = (double)value_1._4_4_;
                    }
                    else {
                      attributes_definition->name = (char *)(double)value_1._4_4_;
                    }
                  }
                  else if (nelems._4_4_ == 6) {
                    iVar2 = read_bytes((coda_product *)offset_local[9],(int64_t)*attributes_local,8,
                                       &value_2);
                    if (iVar2 < 0) {
                      free(pcStack_80);
                      coda_dynamic_type_delete((coda_dynamic_type *)conversion_local->numerator);
                      return -1;
                    }
                    swap8(&value_2);
                    if (*pcStack_80 == 's') {
                      *(anon_union_8_10_151d62c6 *)attributes_definition = value_2;
                    }
                    else {
                      attributes_definition->name = (char *)value_2;
                    }
                  }
                }
                if (((value_length == 1) && (nelems._4_4_ != 2)) &&
                   ((iVar2 = strcmp(pcStack_80,"missing_value"), iVar2 == 0 ||
                    ((iVar2 = strcmp(pcStack_80,"_FillValue"), iVar2 == 0 &&
                     (iVar2 = coda_isNaN((double)attributes_definition->description), iVar2 != 0))))
                   )) {
                  iVar2 = read_bytes((coda_product *)offset_local[9],(int64_t)*attributes_local,
                                     (int64_t)name,&array);
                  if (iVar2 < 0) {
                    free(pcStack_80);
                    coda_dynamic_type_delete((coda_dynamic_type *)conversion_local->numerator);
                    return -1;
                  }
                  switch(nelems._4_4_) {
                  case 1:
                    attributes_definition->description = (char *)(double)(int)(char)(byte)array;
                    break;
                  default:
                    __assert_fail("0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-netcdf.c"
                                  ,0x1af,
                                  "int read_att_array(coda_netcdf_product *, int64_t *, coda_mem_record **, coda_conversion *)"
                                 );
                  case 3:
                    swap2(&array);
                    attributes_definition->description =
                         (char *)(double)(int)CONCAT11(array._1_1_,(byte)array);
                    break;
                  case 4:
                    swap4(&array);
                    attributes_definition->description =
                         (char *)(double)CONCAT22(array._2_2_,CONCAT11(array._1_1_,(byte)array));
                    break;
                  case 5:
                    swap4(&array);
                    attributes_definition->description =
                         (char *)(double)(float)CONCAT22(array._2_2_,
                                                         CONCAT11(array._1_1_,(byte)array));
                    break;
                  case 6:
                    swap8(&array);
                    attributes_definition->description =
                         (char *)CONCAT44(array._4_4_,
                                          CONCAT22(array._2_2_,CONCAT11(array._1_1_,(byte)array)));
                    break;
                  case 7:
                    attributes_definition->description = (char *)(double)(byte)array;
                    break;
                  case 8:
                    swap2(&array);
                    attributes_definition->description =
                         (char *)(double)CONCAT11(array._1_1_,(byte)array);
                    break;
                  case 9:
                    swap4(&array);
                    attributes_definition->description =
                         (char *)(double)CONCAT22(array._2_2_,CONCAT11(array._1_1_,(byte)array));
                    break;
                  case 10:
                    swap8(&array);
                    attributes_definition->description =
                         (char *)(double)CONCAT44(array._4_4_,
                                                  CONCAT22(array._2_2_,
                                                           CONCAT11(array._1_1_,(byte)array)));
                    break;
                  case 0xb:
                    swap8(&array);
                    uVar1 = CONCAT22(array._2_2_,CONCAT11(array._1_1_,(byte)array));
                    auVar4._4_4_ = array._4_4_;
                    auVar4._0_4_ = uVar1;
                    auVar4._8_4_ = array._4_4_;
                    auVar4._12_4_ = 0x45300000;
                    attributes_definition->description =
                         (char *)((auVar4._8_8_ - 1.9342813113834067e+25) +
                                 ((double)CONCAT44(0x43300000,uVar1) - 4503599627370496.0));
                  }
                }
              }
              if (nelems._4_4_ == 2) {
                string_length =
                     (int64_t)coda_netcdf_basic_type_new
                                        (2,(int64_t)*attributes_local,0,value_length);
              }
              else {
                string_length =
                     (int64_t)coda_netcdf_basic_type_new
                                        (nelems._4_4_,(int64_t)*attributes_local,0,1);
              }
              if (string_length == 0) {
                free(pcStack_80);
                coda_dynamic_type_delete((coda_dynamic_type *)conversion_local->numerator);
                return -1;
              }
              *attributes_local = (coda_mem_record *)(name + (long)*attributes_local);
              if (((ulong)name & 3) != 0) {
                *attributes_local =
                     (coda_mem_record *)((4 - ((ulong)name & 3)) + (long)*attributes_local);
              }
              if ((nelems._4_4_ == 2) || (value_length == 1)) {
                iVar2 = coda_mem_record_add_field
                                  ((coda_mem_record *)conversion_local->numerator,pcStack_80,
                                   (coda_dynamic_type *)string_length,1);
                if (iVar2 != 0) {
                  coda_dynamic_type_delete((coda_dynamic_type *)string_length);
                  free(pcStack_80);
                  coda_dynamic_type_delete((coda_dynamic_type *)conversion_local->numerator);
                  return -1;
                }
              }
              else {
                local_e8 = value_length;
                field_type = coda_netcdf_array_new
                                       (1,&local_e8,(coda_netcdf_basic_type *)string_length);
                if (field_type == (coda_netcdf_array *)0x0) {
                  coda_dynamic_type_delete((coda_dynamic_type *)string_length);
                  free(pcStack_80);
                  coda_dynamic_type_delete((coda_dynamic_type *)conversion_local->numerator);
                  return -1;
                }
                iVar2 = coda_mem_record_add_field
                                  ((coda_mem_record *)conversion_local->numerator,pcStack_80,
                                   (coda_dynamic_type *)field_type,1);
                if (iVar2 != 0) {
                  coda_dynamic_type_delete((coda_dynamic_type *)field_type);
                  free(pcStack_80);
                  coda_dynamic_type_delete((coda_dynamic_type *)conversion_local->numerator);
                  return -1;
                }
              }
              free(pcStack_80);
            }
            product_local._4_4_ = 0;
          }
        }
      }
      else {
        coda_set_error(-300,"invalid netCDF file (invalid value for NC_ATTRIBUTE tag)");
        product_local._4_4_ = -1;
      }
    }
    else {
      product_local._4_4_ = -1;
    }
  }
  return product_local._4_4_;
}

Assistant:

static int read_att_array(coda_netcdf_product *product, int64_t *offset, coda_mem_record **attributes,
                          coda_conversion *conversion)
{
    coda_type_record *attributes_definition;
    int32_t tag;
    int64_t num_att;
    long i;

    if (read_bytes(product->raw_product, *offset, 4, &tag) < 0)
    {
        return -1;
    }
#ifndef WORDS_BIGENDIAN
    swap_int32(&tag);
#endif
    *offset += 4;

    if (read_length_value(product, offset, &num_att) != 0)
    {
        return -1;
    }
    if (tag == 0)
    {
        *attributes = NULL;
        if (num_att != 0)
        {
            coda_set_error(CODA_ERROR_PRODUCT, "invalid netCDF file (invalid value for nelems for empty att_array)");
            return -1;
        }
        return 0;
    }

    if (tag != 12)      /* NC_ATTRIBUTE */
    {
        coda_set_error(CODA_ERROR_PRODUCT, "invalid netCDF file (invalid value for NC_ATTRIBUTE tag)");
        return -1;
    }

    attributes_definition = coda_type_record_new(coda_format_netcdf);
    if (attributes_definition == NULL)
    {
        return -1;
    }
    *attributes = coda_mem_record_new(attributes_definition, NULL);
    coda_type_release((coda_type *)attributes_definition);
    if (*attributes == NULL)
    {
        return -1;
    }

    for (i = 0; i < num_att; i++)
    {
        coda_netcdf_basic_type *basic_type;
        int64_t string_length;
        int32_t nc_type;
        int64_t nelems;
        long value_length;
        char *name;

        /* nelems */
        if (read_length_value(product, offset, &string_length) != 0)
        {
            coda_dynamic_type_delete((coda_dynamic_type *)*attributes);
            return -1;
        }
        /* chars */
        name = malloc(string_length + 1);
        if (name == NULL)
        {
            coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not allocate %lu bytes) (%s:%u)",
                           (long)(string_length + 1), __FILE__, __LINE__);
            coda_dynamic_type_delete((coda_dynamic_type *)*attributes);
            return -1;
        }
        name[string_length] = '\0';
        if (read_bytes(product->raw_product, *offset, string_length, name) < 0)
        {
            free(name);
            coda_dynamic_type_delete((coda_dynamic_type *)*attributes);
            return -1;
        }
        *offset += string_length;
        /* chars padding */
        if ((string_length & 3) != 0)
        {
            *offset += 4 - (string_length & 3);
        }
        /* nc_type */
        if (read_bytes(product->raw_product, *offset, 4, &nc_type) < 0)
        {
            free(name);
            coda_dynamic_type_delete((coda_dynamic_type *)*attributes);
            return -1;
        }
#ifndef WORDS_BIGENDIAN
        swap_int32(&nc_type);
#endif
        *offset += 4;
        /* nelems */
        if (read_length_value(product, offset, &nelems) != 0)
        {
            free(name);
            coda_dynamic_type_delete((coda_dynamic_type *)*attributes);
            return -1;
        }
        value_length = (long)nelems;
        switch (nc_type)
        {
            case 1:
            case 2:
                break;
            case 3:
                value_length *= 2;
                break;
            case 4:
            case 5:
                value_length *= 4;
                break;
            case 6:
                value_length *= 8;
                break;
            default:
                coda_set_error(CODA_ERROR_PRODUCT, "invalid netCDF file (invalid netcdf type (%d))", (int)nc_type);
                free(name);
                coda_dynamic_type_delete((coda_dynamic_type *)*attributes);
                return -1;
        }

        if (conversion != NULL)
        {
            if (nelems == 1 && (strcmp(name, "scale_factor") == 0 || strcmp(name, "add_offset") == 0))
            {
                if (nc_type == 5)
                {
                    float value;

                    if (read_bytes(product->raw_product, *offset, 4, &value) < 0)
                    {
                        free(name);
                        coda_dynamic_type_delete((coda_dynamic_type *)*attributes);
                        return -1;
                    }
#ifndef WORDS_BIGENDIAN
                    swap_float(&value);
#endif
                    if (name[0] == 's')
                    {
                        conversion->numerator = value;
                    }
                    else
                    {
                        conversion->add_offset = value;
                    }
                }
                else if (nc_type == 6)
                {
                    double value;

                    if (read_bytes(product->raw_product, *offset, 8, &value) < 0)
                    {
                        free(name);
                        coda_dynamic_type_delete((coda_dynamic_type *)*attributes);
                        return -1;
                    }
#ifndef WORDS_BIGENDIAN
                    swap_double(&value);
#endif
                    if (name[0] == 's')
                    {
                        conversion->numerator = value;
                    }
                    else
                    {
                        conversion->add_offset = value;
                    }
                }
            }
            /* note that missing_value has preference over _FillValue */
            /* We therefore don't modify fill_value for _FillValue if fill_value was already set */
            if (nelems == 1 && nc_type != 2 && (strcmp(name, "missing_value") == 0 ||
                                                (strcmp(name, "_FillValue") == 0 &&
                                                 coda_isNaN(conversion->invalid_value))))
            {
                union
                {
                    int8_t as_int8[8];
                    uint8_t as_uint8[8];
                    int16_t as_int16[4];
                    uint16_t as_uint16[4];
                    int32_t as_int32[2];
                    uint32_t as_uint32[2];
                    int64_t as_int64[1];
                    uint64_t as_uint64[1];
                    float as_float[2];
                    double as_double[1];
                } value;

                if (read_bytes(product->raw_product, *offset, value_length, value.as_int8) < 0)
                {
                    free(name);
                    coda_dynamic_type_delete((coda_dynamic_type *)*attributes);
                    return -1;
                }
                switch (nc_type)
                {
                    case 1:
                        conversion->invalid_value = (double)value.as_int8[0];
                        break;
                    case 3:
#ifndef WORDS_BIGENDIAN
                        swap_int16(value.as_int16);
#endif
                        conversion->invalid_value = (double)value.as_int16[0];
                        break;
                    case 4:
#ifndef WORDS_BIGENDIAN
                        swap_int32(value.as_int32);
#endif
                        conversion->invalid_value = (double)value.as_int32[0];
                        break;
                    case 5:
#ifndef WORDS_BIGENDIAN
                        swap_float(value.as_float);
#endif
                        conversion->invalid_value = (double)value.as_float[0];
                        break;
                    case 6:
#ifndef WORDS_BIGENDIAN
                        swap_double(value.as_double);
#endif
                        conversion->invalid_value = value.as_double[0];
                        break;
                    case 7:
                        conversion->invalid_value = (double)value.as_uint8[0];
                        break;
                    case 8:
#ifndef WORDS_BIGENDIAN
                        swap_uint16(value.as_uint16);
#endif
                        conversion->invalid_value = (double)value.as_uint16[0];
                        break;
                    case 9:
#ifndef WORDS_BIGENDIAN
                        swap_uint32(value.as_uint32);
#endif
                        conversion->invalid_value = (double)value.as_uint32[0];
                        break;
                    case 10:
#ifndef WORDS_BIGENDIAN
                        swap_int64(value.as_int64);
#endif
                        conversion->invalid_value = (double)value.as_int64[0];
                        break;
                    case 11:
#ifndef WORDS_BIGENDIAN
                        swap_uint64(value.as_uint64);
#endif
                        conversion->invalid_value = (double)value.as_uint64[0];
                        break;
                    default:
                        assert(0);
                        exit(1);
                }
            }
        }

        if (nc_type == 2)       /* treat char arrays as strings */
        {
            basic_type = coda_netcdf_basic_type_new(nc_type, *offset, 0, nelems);
        }
        else
        {
            basic_type = coda_netcdf_basic_type_new(nc_type, *offset, 0, 1);
        }
        if (basic_type == NULL)
        {
            free(name);
            coda_dynamic_type_delete((coda_dynamic_type *)*attributes);
            return -1;
        }
        *offset += value_length;
        if ((value_length & 3) != 0)
        {
            *offset += 4 - (value_length & 3);
        }

        if (nc_type == 2 || nelems == 1)
        {
            if (coda_mem_record_add_field(*attributes, name, (coda_dynamic_type *)basic_type, 1) != 0)
            {
                coda_dynamic_type_delete((coda_dynamic_type *)basic_type);
                free(name);
                coda_dynamic_type_delete((coda_dynamic_type *)*attributes);
                return -1;
            }
        }
        else
        {
            coda_netcdf_array *array;
            long dim[CODA_MAX_NUM_DIMS];

            dim[0] = (long)nelems;
            array = coda_netcdf_array_new(1, dim, basic_type);
            if (array == NULL)
            {
                coda_dynamic_type_delete((coda_dynamic_type *)basic_type);
                free(name);
                coda_dynamic_type_delete((coda_dynamic_type *)*attributes);
                return -1;
            }
            if (coda_mem_record_add_field(*attributes, name, (coda_dynamic_type *)array, 1) != 0)
            {
                coda_dynamic_type_delete((coda_dynamic_type *)array);
                free(name);
                coda_dynamic_type_delete((coda_dynamic_type *)*attributes);
                return -1;
            }
        }
        free(name);
    }

    return 0;
}